

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.h
# Opt level: O0

void absl::lts_20250127::crc_internal::CrcCordState::Unref(RefcountedRep *r)

{
  int iVar1;
  RefcountedRep *r_local;
  
  if (r != (RefcountedRep *)0x0) {
    LOCK();
    iVar1 = (r->count).super___atomic_base<int>._M_i;
    (r->count).super___atomic_base<int>._M_i = (r->count).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((iVar1 == 1) && (r != (RefcountedRep *)0x0)) {
      RefcountedRep::~RefcountedRep(r);
      operator_delete(r,0x68);
    }
    return;
  }
  __assert_fail("r != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/crc/internal/crc_cord_state.h"
                ,0x92,"static void absl::crc_internal::CrcCordState::Unref(RefcountedRep *)");
}

Assistant:

static void Unref(RefcountedRep* r) {
    assert(r != nullptr);
    if (r->count.fetch_sub(1, std::memory_order_acq_rel) == 1) {
      delete r;
    }
  }